

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O2

void * cgreen_vector_remove(CgreenVector *vector,int position)

{
  void *pvVar1;
  void **ppvVar2;
  int iVar3;
  ulong uVar4;
  
  if (-1 < position) {
    if (vector == (CgreenVector *)0x0) {
      iVar3 = 0;
    }
    else {
      iVar3 = vector->size;
    }
    if (position <= iVar3) {
      pvVar1 = vector->items[(uint)position];
      iVar3 = vector->size;
      uVar4 = (ulong)(uint)position;
      while( true ) {
        ppvVar2 = vector->items;
        if (iVar3 <= position) break;
        ppvVar2[uVar4] = ppvVar2[uVar4 + 1];
        position = position + 1;
        uVar4 = uVar4 + 1;
      }
      ppvVar2[iVar3] = (void *)0x0;
      vector->size = iVar3 + -1;
      return pvVar1;
    }
  }
  panic("src/vector.c",0x3c,"illegal position (%d) in vector operation");
}

Assistant:

void *cgreen_vector_remove(CgreenVector *vector, int position) {
    void *item;
    int i;

    if (position < 0 || position > cgreen_vector_size(vector)) {
        PANIC("illegal position (%d) in vector operation", position);
        return NULL;
    }

    item = vector->items[position];

    for (i = position; i < vector->size; i++) {
        vector->items[i] = vector->items[i + 1];
    }

    vector->items[vector->size] = NULL;

    vector->size--;
    return item;
}